

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O2

double __thiscall
ON_NurbsCurve::GetCubicBezierApproximation
          (ON_NurbsCurve *this,double max_deviation,ON_3dPoint *bezCV)

{
  ON_3dPoint *p;
  uint uVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  double dVar6;
  bool bVar7;
  ON_3dVector *v;
  long lVar8;
  int pass;
  int iVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar14;
  undefined4 uVar15;
  double local_380;
  undefined8 local_378;
  int hint;
  undefined1 local_338 [16];
  ON_3dPoint *local_328;
  double local_320;
  undefined1 local_318 [16];
  ON_3dPoint *local_308;
  long local_2f8;
  double local_2f0;
  ON_3dPoint B;
  ON_3dPoint A;
  ON_3dPoint local_2b8;
  ON_3dPoint local_2a0;
  ON_3dPoint local_288;
  ON_3dPoint local_270;
  ON_3dPoint P [2];
  ON_3dPoint bez1CV [4];
  ON_Interval domain;
  ON_3dPoint local_1b0;
  ON_3dPoint local_198;
  ON_3dVector local_180;
  ON_3dVector D [2];
  double g32 [32];
  
  dVar6 = ON_DBL_QNAN;
  local_2f0 = max_deviation;
  bVar7 = ON_Object::ThisIsNullptr((ON_Object *)this,false);
  if (((bVar7) || (iVar9 = this->m_order, iVar9 < 2)) ||
     (bezCV == (ON_3dPoint *)0x0 || this->m_cv_count < iVar9)) {
    return dVar6;
  }
  if (((this->m_cv_count == 4) && (iVar9 == 4)) && (this->m_is_rat == 0)) {
    pdVar2 = this->m_knot;
    if ((*pdVar2 == pdVar2[2]) && (!NAN(*pdVar2) && !NAN(pdVar2[2]))) {
      if ((pdVar2[3] == pdVar2[5]) && (!NAN(pdVar2[3]) && !NAN(pdVar2[5]))) {
        GetCV(this,0,bezCV);
        GetCV(this,1,bezCV + 1);
        GetCV(this,2,bezCV + 2);
        GetCV(this,3,bezCV + 3);
        uVar10 = 0;
        uVar12 = 0;
LAB_005516ec:
        return (double)CONCAT44(uVar12,uVar10);
      }
    }
  }
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  local_2a0.z = ON_3dPoint::Origin.z;
  local_2a0.x = ON_3dPoint::Origin.x;
  local_2a0.y = ON_3dPoint::Origin.y;
  local_288.x = ON_3dPoint::Origin.x;
  local_288.y = ON_3dPoint::Origin.y;
  local_288.z = ON_3dPoint::Origin.z;
  bez1CV[0].z = ON_3dPoint::Origin.z;
  bez1CV[0].x = ON_3dPoint::Origin.x;
  bez1CV[0].y = ON_3dPoint::Origin.y;
  bez1CV[1].x = ON_3dPoint::Origin.x;
  bez1CV[1].y = ON_3dPoint::Origin.y;
  bez1CV[1].z = ON_3dPoint::Origin.z;
  bez1CV[2].x = ON_3dPoint::Origin.x;
  bez1CV[2].y = ON_3dPoint::Origin.y;
  bez1CV[2].z = ON_3dPoint::Origin.z;
  bez1CV[3].x = ON_3dPoint::Origin.x;
  bez1CV[3].y = ON_3dPoint::Origin.y;
  bez1CV[3].z = ON_3dPoint::Origin.z;
  dVar3 = ON_Interval::operator[](&domain,0);
  local_328 = bezCV;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3b])
            (SUB84(dVar3,0),this,1,3,bez1CV,0,0);
  dVar3 = ON_Interval::operator[](&domain,1);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3b])
            (SUB84(dVar3,0),this,1,3,bez1CV + 2,0,0);
  local_2b8.x = bez1CV[0].x;
  local_2b8.y = bez1CV[0].y;
  local_2b8.z = bez1CV[0].z;
  local_270.x = bez1CV[2].x;
  local_270.y = bez1CV[2].y;
  local_270.z = bez1CV[2].z;
  dVar3 = ON_Interval::operator[](&domain,1);
  dVar4 = ON_Interval::operator[](&domain,0);
  ::operator*((ON_3dPoint *)g32,dVar3 - dVar4,bez1CV + 1);
  ON_3dVector::ON_3dVector(D,(ON_3dPoint *)g32);
  ::operator*(P,dVar3 - dVar4,bez1CV + 3);
  ON_3dVector::ON_3dVector(D + 1,P);
  ON_3dVector::operator/((ON_3dVector *)P,D,3.0);
  ON_3dPoint::operator+((ON_3dPoint *)g32,&local_2b8,(ON_3dVector *)P);
  bez1CV[1].z = g32[2];
  bez1CV[1].x = g32[0];
  bez1CV[1].y = g32[1];
  ON_3dVector::operator/((ON_3dVector *)P,D + 1,3.0);
  ON_3dPoint::operator-((ON_3dPoint *)g32,&local_270,(ON_3dVector *)P);
  bez1CV[2].z = g32[2];
  bez1CV[2].x = g32[0];
  bez1CV[2].y = g32[1];
  bez1CV[3].x = local_270.x;
  bez1CV[3].y = local_270.y;
  bez1CV[3].z = local_270.z;
  P[0].z = ON_3dPoint::Origin.z;
  P[0].x = ON_3dPoint::Origin.x;
  P[0].y = ON_3dPoint::Origin.y;
  p = P + 1;
  P[1].x = ON_3dPoint::Origin.x;
  P[1].y = ON_3dPoint::Origin.y;
  P[1].z = ON_3dPoint::Origin.z;
  hint = 0;
  dVar3 = ON_Interval::ParameterAt(&domain,0.3333333333333333);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3b])
            (SUB84(dVar3,0),this,0,3,P,0,&hint);
  dVar3 = ON_Interval::ParameterAt(&domain,0.6666666666666666);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3b])
            (SUB84(dVar3,0),this,0,3,p,0,&hint);
  ::operator*(&B,2.5,&local_2b8);
  ON_3dPoint::operator-((ON_3dVector *)&A,&local_270,&B);
  ON_3dVector::operator/((ON_3dVector *)local_318,(ON_3dVector *)&A,3.0);
  ::operator*(&local_198,3.0,P);
  ::operator*(&local_1b0,1.5,p);
  ON_3dPoint::operator-(&local_180,&local_198,&local_1b0);
  ON_3dVector::operator+((ON_3dVector *)g32,(ON_3dVector *)local_318,&local_180);
  ON_3dPoint::operator=(&local_2a0,(ON_3dVector *)g32);
  ::operator*(&B,2.5,&local_270);
  ON_3dPoint::operator-((ON_3dVector *)&A,&local_2b8,&B);
  ON_3dVector::operator/((ON_3dVector *)local_318,(ON_3dVector *)&A,3.0);
  ::operator*(&local_198,3.0,p);
  ::operator*(&local_1b0,1.5,P);
  ON_3dPoint::operator-(&local_180,&local_198,&local_1b0);
  v = (ON_3dVector *)g32;
  ON_3dVector::operator+(v,(ON_3dVector *)local_318,&local_180);
  ON_3dPoint::operator=(&local_288,v);
  uVar1 = this->m_cv_count;
  if ((this->m_order == 4) && (uVar1 == 4)) {
    dVar3 = 0.0;
    local_378 = 0.0;
    if (this->m_is_rat == 0) {
LAB_005512a8:
      local_328->z = bez1CV[0].z;
      local_328->x = bez1CV[0].x;
      local_328->y = bez1CV[0].y;
      local_328[1].z = bez1CV[1].z;
      local_328[1].x = bez1CV[1].x;
      local_328[1].y = bez1CV[1].y;
      local_328[2].z = bez1CV[2].z;
      local_328[2].x = bez1CV[2].x;
      local_328[2].y = bez1CV[2].y;
      local_328[3].x = bez1CV[3].x;
      local_328[3].y = bez1CV[3].y;
      local_328[3].z = bez1CV[3].z;
      return (double)(-(ulong)(dVar3 < local_378) & (ulong)local_378);
    }
  }
  if (0x20 < (int)uVar1) {
    v = (ON_3dVector *)onmalloc((ulong)uVar1 << 3);
  }
  GetGrevilleAbcissae(this,&v->x);
  if (this->m_order == 3) {
    pdVar2 = this->m_knot;
    dVar3 = pdVar2[2];
    if (*pdVar2 <= dVar3 && dVar3 != *pdVar2) {
      v->x = dVar3;
      v->y = (pdVar2[2] + pdVar2[2] + pdVar2[3]) / 3.0;
    }
    lVar8 = (long)this->m_cv_count;
    if (pdVar2[lVar8] < pdVar2[lVar8 + 2]) {
      *(double *)((long)v + lVar8 * 8 + -8) = pdVar2[lVar8];
      *(double *)((long)v + lVar8 * 8 + -0x10) =
           (pdVar2[lVar8] + pdVar2[lVar8] + pdVar2[lVar8 + -1]) / 3.0;
    }
  }
  ON_BezierCurve::ON_BezierCurve((ON_BezierCurve *)local_318);
  local_318._0_8_ = 1.48219693752374e-323;
  local_318._8_8_ = 6.36598737487208e-314;
  local_308 = &local_2b8;
  ON_BezierCurve::Evaluate((ON_BezierCurve *)local_318,0.3333333333333333,0,3,&A.x);
  ON_BezierCurve::Evaluate((ON_BezierCurve *)local_318,0.6666666666666666,0,3,&B.x);
  dVar3 = ON_3dPoint::DistanceTo(P,&A);
  dVar4 = ON_3dPoint::DistanceTo(p,&B);
  dVar3 = (dVar3 + dVar4) * 16.0 + 1e-14;
  lVar8 = 1;
  local_380 = 0.0;
  local_378 = 0.0;
LAB_0055147d:
  local_2f8 = (long)this->m_cv_count;
  if (lVar8 < local_2f8) {
    iVar9 = 0;
    do {
      if (iVar9 == 0) {
        dVar4 = (*(double *)((long)v + lVar8 * 8 + -8) + (&v->x)[lVar8]) * 0.5;
      }
      else {
        if (iVar9 == 2) goto LAB_005515f2;
        dVar4 = (&v->x)[lVar8];
      }
      local_338._0_8_ = dVar4;
      dVar4 = ON_Interval::NormalizedParameterAt(&domain,dVar4);
      uVar14 = SUB84(local_380,0);
      uVar15 = (undefined4)((ulong)local_380 >> 0x20);
      uVar11 = SUB84(local_378,0);
      uVar13 = (undefined4)((ulong)local_378 >> 0x20);
      uVar10 = uVar11;
      uVar12 = uVar13;
      if ((0.0 < dVar4) && (local_320 = dVar4, dVar4 < 1.0)) {
        (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3b])
                  (local_338._0_4_,this,0,3,&A,0,&hint);
        local_308 = &local_2b8;
        ON_BezierCurve::Evaluate((ON_BezierCurve *)local_318,local_320,0,3,&B.x);
        dVar4 = ON_3dPoint::DistanceTo(&A,&B);
        local_338._8_4_ = extraout_XMM0_Dc;
        local_338._0_8_ = dVar4;
        local_338._12_4_ = extraout_XMM0_Dd;
        local_308 = bez1CV;
        ON_BezierCurve::Evaluate((ON_BezierCurve *)local_318,local_320,0,3,&B.x);
        dVar4 = ON_3dPoint::DistanceTo(&A,&B);
        uVar10 = local_338._0_4_;
        uVar12 = local_338._4_4_;
        if (local_338._0_8_ <= local_380) {
          uVar10 = uVar14;
          uVar12 = uVar15;
        }
        uVar15 = uVar12;
        uVar14 = uVar10;
        uVar10 = SUB84(dVar4,0);
        uVar12 = (int)((ulong)dVar4 >> 0x20);
        if (dVar4 <= local_378) {
          uVar10 = uVar11;
          uVar12 = uVar13;
        }
        if ((dVar3 < local_2f0) &&
           (local_2f0 <= (double)CONCAT44(uVar15,uVar14) &&
            (double)CONCAT44(uVar15,uVar14) != local_2f0)) {
          if (local_2f0 <= (double)CONCAT44(uVar12,uVar10) &&
              (double)CONCAT44(uVar12,uVar10) != local_2f0) goto LAB_00551632;
        }
      }
      iVar9 = iVar9 + 1;
      local_380 = (double)CONCAT44(uVar15,uVar14);
      local_378 = (double)CONCAT44(uVar12,uVar10);
    } while( true );
  }
  local_308 = (ON_3dPoint *)0x0;
  uVar10 = SUB84(local_378,0);
  uVar12 = (undefined4)((ulong)local_378 >> 0x20);
  uVar14 = SUB84(local_380,0);
  uVar15 = (undefined4)((ulong)local_380 >> 0x20);
  if (v == (ON_3dVector *)g32) {
    local_338._8_4_ = 0;
    local_338._12_4_ = 0;
  }
  else {
    onfree(v);
    local_338._8_4_ = 0;
    local_338._12_4_ = 0;
  }
LAB_00551632:
  local_378 = (double)CONCAT44(uVar12,uVar10);
  local_338._4_4_ = uVar15;
  local_338._0_4_ = uVar14;
  ON_BezierCurve::~ON_BezierCurve((ON_BezierCurve *)local_318);
  if (lVar8 < local_2f8) {
    return dVar6;
  }
  if ((local_378 <= dVar3) || (local_378 <= (double)local_338._0_8_)) goto LAB_005512a8;
  local_328->z = local_2b8.z;
  local_328->x = local_2b8.x;
  local_328->y = local_2b8.y;
  local_328[1].z = local_2a0.z;
  local_328[1].x = local_2a0.x;
  local_328[1].y = local_2a0.y;
  local_328[2].z = local_288.z;
  local_328[2].x = local_288.x;
  local_328[2].y = local_288.y;
  local_328[3].x = local_270.x;
  local_328[3].y = local_270.y;
  local_328[3].z = local_270.z;
  uVar5 = -(ulong)(dVar3 < (double)local_338._0_8_) & local_338._0_8_;
  uVar10 = (undefined4)uVar5;
  uVar12 = (undefined4)(uVar5 >> 0x20);
  goto LAB_005516ec;
LAB_005515f2:
  lVar8 = lVar8 + 1;
  goto LAB_0055147d;
}

Assistant:

double ON_NurbsCurve::GetCubicBezierApproximation(
  double max_deviation,
  ON_3dPoint bezCV[4]
) const
{
  const double failed_rc = ON_DBL_QNAN;

  if (ThisIsNullptr(false))
    return failed_rc;
  if (m_order < 2)
    return failed_rc;
  if (m_cv_count < m_order)
    return failed_rc;
  if ( nullptr == bezCV)
    return failed_rc;

  if (
    0 == m_is_rat
    && 4 == m_order
    && 4 == m_cv_count
    && m_knot[0] == m_knot[2]
    && m_knot[3] == m_knot[5]
    )
  {
    GetCV(0, bezCV[0]);
    GetCV(1, bezCV[1]);
    GetCV(2, bezCV[2]);
    GetCV(3, bezCV[3]);
    return 0.0;
  }

  const ON_Interval domain = Domain();


  // bez0CV[] are cubic bezier control points set from end locations and interpolating 2 interior points.
  ON_3dPoint bez0CV[4] = { ON_3dPoint::Origin, ON_3dPoint::Origin, ON_3dPoint::Origin, ON_3dPoint::Origin };
  // bez1CV[] are cubic bezier control points set from end locations and derivatives.
  ON_3dPoint bez1CV[4] = { ON_3dPoint::Origin, ON_3dPoint::Origin, ON_3dPoint::Origin, ON_3dPoint::Origin };

  // bez1CV[] are cubic bezier control points set from end locations and derivatives.
  Evaluate(domain[0], 1, 3, &bez1CV[0].x, 0, nullptr);
  Evaluate(domain[1], 1, 3, &bez1CV[2].x, 0, nullptr);
  bez0CV[0] = bez1CV[0];
  bez0CV[3] = bez1CV[2];
  const double c = domain[1] - domain[0];
  const ON_3dVector D[2]{ c * bez1CV[1], c * bez1CV[3] };
  bez1CV[1] = bez0CV[0] + D[0]/3.0;
  bez1CV[2] = bez0CV[3] - D[1]/3.0;
  bez1CV[3] = bez0CV[3];

  // bez0CV[] are cubic bezier control points set from end locations and interpolating 2 interior points.
  ON_3dPoint P[2] = {ON_3dPoint::Origin,ON_3dPoint::Origin};
  int hint = 0;
  Evaluate(domain.ParameterAt(1.0/3.0), 0, 3, &P[0].x, 0, &hint);
  Evaluate(domain.ParameterAt(2.0/3.0), 0, 3, &P[1].x, 0, &hint);
  bez0CV[1] = (bez0CV[3] - 2.5*bez0CV[0])/3.0 + (3.0*P[0] - 1.5*P[1]);
  bez0CV[2] = (bez0CV[0] - 2.5*bez0CV[3])/3.0 + (3.0*P[1] - 1.5*P[0]);

  double zero_tol = 0.0;
  double deviation0 = 0.0;
  double deviation1 = 0.0;
  if (4 != m_order || 4 != m_cv_count || 0 != m_is_rat)
  {
    // g[] = parameters for evaluation test
    double g32[32];
    double* g = (m_cv_count <= 32) ? g32 : (double*)onmalloc(m_cv_count * sizeof(g[0]));
    GetGrevilleAbcissae(g);
    if (3 == m_order)
    {
      const double* k = m_knot;
      if (k[0] < k[2])
      {
        g[0] = k[2];
        g[1] = (2.0*k[2] + k[3]) / 3.0;
      }
      k += (m_cv_count - m_order);
      if (k[3] < k[5])
      {
        g[m_cv_count - 1] = k[3];
        g[m_cv_count - 2] = (2.0*k[3] + k[2]) / 3.0;
      }
    }
  
    // test evaluation
    ON_BezierCurve bez;
    bez.m_dim = 3;
    bez.m_is_rat = 0;
    bez.m_order = 4;
    bez.m_cv_stride = 3;
    bez.m_cv = &bez0CV[0].x;

    ON_3dPoint A, B;
    bez.Evaluate(1.0 / 3.0, 0, 3, &A.x);
    bez.Evaluate(2.0 / 3.0, 0, 3, &B.x);
    zero_tol = 16.0*(P[0].DistanceTo(A) + P[1].DistanceTo(B)) + 1.0e-14;
    double d;
    for (int i = 1; i < m_cv_count; i++)
    {
      for (int pass = 0; pass < 2; pass++)
      {
        const double t = (0==pass) ? 0.5*(g[i - 1] + g[i]) : g[i];
        const double s = domain.NormalizedParameterAt(t);
        if (false == (s > 0.0 && s < 1.0))
          continue;

        Evaluate(t, 0, 3, &A.x, 0, &hint);

        // test bez0CV[]
        bez.m_cv = &bez0CV[0].x;
        bez.Evaluate(s, 0, 3, &B.x);
        d = A.DistanceTo(B);
        if (d > deviation0)
          deviation0 = d;

        // test bez1CV[]
        bez.m_cv = &bez1CV[0].x;
        bez.Evaluate(s, 0, 3, &B.x);
        d = A.DistanceTo(B);
        if (d > deviation1)
          deviation1 = d;

        if (max_deviation > zero_tol && deviation0 > max_deviation && deviation1 > max_deviation)
          return failed_rc;
      }
    }

    bez.m_cv = nullptr;

    if (g != g32)
      onfree(g);
  }


  if (deviation1 <= zero_tol || deviation1 <= deviation0)
  {
    // use cubic bezier CVs calculated from end locations and interpolating end derivatives.
    bezCV[0] = bez1CV[0];
    bezCV[1] = bez1CV[1];
    bezCV[2] = bez1CV[2];
    bezCV[3] = bez1CV[3];
    return (deviation1 > zero_tol) ? deviation1 : 0.0;
  }

  // use cubic bezier CVs calculated from end locations and interpolating 2 interior points.
  bezCV[0] = bez0CV[0];
  bezCV[1] = bez0CV[1];
  bezCV[2] = bez0CV[2];
  bezCV[3] = bez0CV[3];
  return (deviation0 > zero_tol) ? deviation0 : 0.0;
}